

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::ServiceOptions::SharedCtor(ServiceOptions *this,Arena *arena)

{
  Arena *arena_local;
  ServiceOptions *this_local;
  
  MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 0x38),0,9);
  return;
}

Assistant:

inline void ServiceOptions::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, features_),
           0,
           offsetof(Impl_, deprecated_) -
               offsetof(Impl_, features_) +
               sizeof(Impl_::deprecated_));
}